

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::default_cost_type<float>::make_l1_norm(default_cost_type<float> *this,int n)

{
  float *pfVar1;
  float *pfVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  byte bVar18;
  byte bVar19;
  float fVar20;
  ulong uVar21;
  ushort uVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  float fVar29;
  undefined1 auVar30 [16];
  
  if (n != 0) {
    auVar30._8_4_ = 0x7fffffff;
    auVar30._0_8_ = 0x7fffffff7fffffff;
    auVar30._12_4_ = 0x7fffffff;
    fVar29 = 0.0;
    uVar21 = 0;
    do {
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl + uVar21;
      uVar21 = uVar21 + 1;
      auVar16 = vandps_avx(ZEXT416((uint)*pfVar2),auVar30);
      fVar29 = fVar29 + auVar16._0_4_;
    } while ((uint)n != uVar21);
    fVar20 = ABS(fVar29);
    if (((uint)fVar20 < 0x7f800001 && n != 0) &&
        (0x7ffffe < (int)fVar20 - 1U && (fVar20 != INFINITY && fVar29 != 0.0))) {
      auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      pfVar2 = (this->linear_elements)._M_t.
               super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
               super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
               super__Head_base<0UL,_float_*,_false>._M_head_impl;
      auVar25 = vbroadcastss_avx512f(ZEXT416((uint)fVar29));
      auVar26 = vpbroadcastq_avx512f();
      uVar21 = 0;
      do {
        auVar27 = vpbroadcastq_avx512f();
        auVar28 = vporq_avx512f(auVar27,auVar23);
        auVar27 = vporq_avx512f(auVar27,auVar24);
        uVar17 = vpcmpuq_avx512f(auVar27,auVar26,2);
        bVar18 = (byte)uVar17;
        uVar17 = vpcmpuq_avx512f(auVar28,auVar26,2);
        bVar19 = (byte)uVar17;
        uVar22 = CONCAT11(bVar19,bVar18);
        pfVar1 = pfVar2 + uVar21;
        auVar27._4_4_ = (uint)((byte)(uVar22 >> 1) & 1) * (int)pfVar1[1];
        auVar27._0_4_ = (uint)(bVar18 & 1) * (int)*pfVar1;
        auVar27._8_4_ = (uint)((byte)(uVar22 >> 2) & 1) * (int)pfVar1[2];
        auVar27._12_4_ = (uint)((byte)(uVar22 >> 3) & 1) * (int)pfVar1[3];
        auVar27._16_4_ = (uint)((byte)(uVar22 >> 4) & 1) * (int)pfVar1[4];
        auVar27._20_4_ = (uint)((byte)(uVar22 >> 5) & 1) * (int)pfVar1[5];
        auVar27._24_4_ = (uint)((byte)(uVar22 >> 6) & 1) * (int)pfVar1[6];
        auVar27._28_4_ = (uint)((byte)(uVar22 >> 7) & 1) * (int)pfVar1[7];
        auVar27._32_4_ = (uint)(bVar19 & 1) * (int)pfVar1[8];
        auVar27._36_4_ = (uint)(bVar19 >> 1 & 1) * (int)pfVar1[9];
        auVar27._40_4_ = (uint)(bVar19 >> 2 & 1) * (int)pfVar1[10];
        auVar27._44_4_ = (uint)(bVar19 >> 3 & 1) * (int)pfVar1[0xb];
        auVar27._48_4_ = (uint)(bVar19 >> 4 & 1) * (int)pfVar1[0xc];
        auVar27._52_4_ = (uint)(bVar19 >> 5 & 1) * (int)pfVar1[0xd];
        auVar27._56_4_ = (uint)(bVar19 >> 6 & 1) * (int)pfVar1[0xe];
        auVar27._60_4_ = (uint)(bVar19 >> 7) * (int)pfVar1[0xf];
        auVar27 = vdivps_avx512f(auVar27,auVar25);
        pfVar1 = pfVar2 + uVar21;
        bVar3 = (bool)((byte)(uVar22 >> 1) & 1);
        bVar4 = (bool)((byte)(uVar22 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar22 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar22 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar22 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar22 >> 6) & 1);
        bVar9 = (bool)((byte)(uVar22 >> 7) & 1);
        bVar10 = (bool)(bVar19 >> 1 & 1);
        bVar11 = (bool)(bVar19 >> 2 & 1);
        bVar12 = (bool)(bVar19 >> 3 & 1);
        bVar13 = (bool)(bVar19 >> 4 & 1);
        bVar14 = (bool)(bVar19 >> 5 & 1);
        bVar15 = (bool)(bVar19 >> 6 & 1);
        *pfVar1 = (float)((uint)(bVar18 & 1) * auVar27._0_4_ |
                         (uint)!(bool)(bVar18 & 1) * (int)*pfVar1);
        pfVar1[1] = (float)((uint)bVar3 * auVar27._4_4_ | (uint)!bVar3 * (int)pfVar1[1]);
        pfVar1[2] = (float)((uint)bVar4 * auVar27._8_4_ | (uint)!bVar4 * (int)pfVar1[2]);
        pfVar1[3] = (float)((uint)bVar5 * auVar27._12_4_ | (uint)!bVar5 * (int)pfVar1[3]);
        pfVar1[4] = (float)((uint)bVar6 * auVar27._16_4_ | (uint)!bVar6 * (int)pfVar1[4]);
        pfVar1[5] = (float)((uint)bVar7 * auVar27._20_4_ | (uint)!bVar7 * (int)pfVar1[5]);
        pfVar1[6] = (float)((uint)bVar8 * auVar27._24_4_ | (uint)!bVar8 * (int)pfVar1[6]);
        pfVar1[7] = (float)((uint)bVar9 * auVar27._28_4_ | (uint)!bVar9 * (int)pfVar1[7]);
        pfVar1[8] = (float)((uint)(bVar19 & 1) * auVar27._32_4_ |
                           (uint)!(bool)(bVar19 & 1) * (int)pfVar1[8]);
        pfVar1[9] = (float)((uint)bVar10 * auVar27._36_4_ | (uint)!bVar10 * (int)pfVar1[9]);
        pfVar1[10] = (float)((uint)bVar11 * auVar27._40_4_ | (uint)!bVar11 * (int)pfVar1[10]);
        pfVar1[0xb] = (float)((uint)bVar12 * auVar27._44_4_ | (uint)!bVar12 * (int)pfVar1[0xb]);
        pfVar1[0xc] = (float)((uint)bVar13 * auVar27._48_4_ | (uint)!bVar13 * (int)pfVar1[0xc]);
        pfVar1[0xd] = (float)((uint)bVar14 * auVar27._52_4_ | (uint)!bVar14 * (int)pfVar1[0xd]);
        pfVar1[0xe] = (float)((uint)bVar15 * auVar27._56_4_ | (uint)!bVar15 * (int)pfVar1[0xe]);
        pfVar1[0xf] = (float)((uint)(bVar19 >> 7) * auVar27._60_4_ |
                             (uint)!(bool)(bVar19 >> 7) * (int)pfVar1[0xf]);
        uVar21 = uVar21 + 0x10;
      } while (((ulong)(uint)n + 0xf & 0xfffffffffffffff0) != uVar21);
    }
  }
  return;
}

Assistant:

void make_l1_norm(int n)
    {
        Float div = { 0 };

        for (int i = 0; i != n; ++i)
            div += std::abs(linear_elements[i]);

        if (std::isnormal(div))
            for (int i = 0; i != n; ++i)
                linear_elements[i] /= div;
    }